

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::read
          (PromisedAsyncIoStream *this,int __fd,void *__buf,size_t __nbytes)

{
  AsyncIoStream *pAVar1;
  undefined4 in_register_00000034;
  Own<kj::AsyncIoStream,_std::nullptr_t> *in_R8;
  Own<kj::AsyncIoStream,_std::nullptr_t> *local_40;
  Own<kj::AsyncIoStream,_std::nullptr_t> *s;
  Own<kj::AsyncIoStream,_std::nullptr_t> *_s2371;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  PromisedAsyncIoStream *this_local;
  
  buffer_local = (void *)CONCAT44(in_register_00000034,__fd);
  _s2371 = in_R8;
  maxBytes_local = __nbytes;
  minBytes_local = (size_t)__buf;
  this_local = this;
  local_40 = kj::_::readMaybe<kj::AsyncIoStream,decltype(nullptr)>
                       ((Maybe<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
                        ((long)buffer_local + 0x28));
  s = local_40;
  if (local_40 == (Own<kj::AsyncIoStream,_std::nullptr_t> *)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&stack0xffffffffffffffb8);
    Promise<void>::
    then<kj::(anonymous_namespace)::PromisedAsyncIoStream::read(void*,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(Type *)&stack0xffffffffffffffb8);
    Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffb8);
  }
  else {
    pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(local_40);
    (**(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream)
              (this,pAVar1,minBytes_local,maxBytes_local,_s2371);
  }
  return (ssize_t)this;
}

Assistant:

kj::Promise<size_t> read(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_IF_SOME(s, stream) {
      return s->read(buffer, minBytes, maxBytes);
    } else {
      return promise.addBranch().then([this,buffer,minBytes,maxBytes]() {
        return KJ_ASSERT_NONNULL(stream)->read(buffer, minBytes, maxBytes);
      });
    }